

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  int iVar1;
  LogMessage *pLVar2;
  undefined4 extraout_var;
  StringOutputStream output_stream;
  TextGenerator generator;
  StringOutputStream local_80;
  TextGenerator local_70;
  
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/text_format.cc"
               ,0x4aa);
    pLVar2 = internal::LogMessage::operator<<((LogMessage *)&local_70,"CHECK failed: output: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"output specified is NULL");
    internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&local_70);
  }
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream(&local_80,output);
  TextGenerator::TextGenerator
            (&local_70,&local_80.super_ZeroCopyOutputStream,this->initial_indent_level_);
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  PrintFieldValue(this,message,(Reflection *)CONCAT44(extraout_var,iVar1),field,index,&local_70);
  TextGenerator::~TextGenerator(&local_70);
  io::StringOutputStream::~StringOutputStream(&local_80);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(
    const Message& message,
    const FieldDescriptor* field,
    int index,
    string* output) const {

  GOOGLE_DCHECK(output) << "output specified is NULL";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, generator);
}